

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Turnning.c
# Opt level: O1

double calculateAngle325(double *list,int size)

{
  void *__ptr;
  void *__ptr_00;
  long lVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  if (size == 0) {
    return 0.0;
  }
  __ptr = malloc(8);
  __ptr_00 = malloc(8);
  if (size < 1) {
    dVar8 = 0.0;
    uVar2 = 0;
    uVar4 = 0;
  }
  else {
    uVar3 = 0;
    iVar5 = 0;
    uVar4 = 0;
    uVar2 = 0;
    do {
      dVar8 = list[uVar3];
      if (0.0 <= dVar8) {
        lVar1 = (long)(int)uVar4;
        uVar4 = uVar4 + 1;
        *(double *)((long)__ptr + lVar1 * 8) = dVar8;
        __ptr = realloc(__ptr,lVar1 * 8 + 0x10);
      }
      else {
        lVar1 = (long)(int)uVar2;
        uVar2 = uVar2 + 1;
        *(double *)((long)__ptr_00 + lVar1 * 8) = dVar8;
        __ptr_00 = realloc(__ptr_00,lVar1 * 8 + 0x10);
      }
      iVar5 = iVar5 + (uint)(90.0 < ABS(list[uVar3]));
      uVar3 = uVar3 + 1;
    } while ((uint)size != uVar3);
    dVar8 = (double)iVar5;
  }
  dVar7 = (double)size;
  if (uVar4 == 0) {
LAB_00107fb3:
    if (0 < size) {
      dVar8 = 0.0;
      uVar3 = 0;
      do {
        dVar8 = dVar8 + list[uVar3];
        uVar3 = uVar3 + 1;
      } while ((uint)size != uVar3);
      goto LAB_00107ff1;
    }
  }
  else {
    dVar6 = (double)(int)uVar4;
    if ((dVar6 == dVar7) && (!NAN(dVar6) && !NAN(dVar7))) goto LAB_00107fb3;
    if (dVar7 * 0.3 < dVar8) {
      dVar8 = 0.0;
      dVar9 = 0.0;
      if (0 < (int)uVar4) {
        uVar3 = 0;
        do {
          dVar9 = dVar9 + *(double *)((long)__ptr + uVar3 * 8);
          uVar3 = uVar3 + 1;
        } while (uVar4 != uVar3);
      }
      if (0 < (int)uVar2) {
        dVar8 = 0.0;
        uVar3 = 0;
        do {
          dVar8 = dVar8 + *(double *)((long)__ptr_00 + uVar3 * 8);
          uVar3 = uVar3 + 1;
        } while (uVar2 != uVar3);
      }
      dVar8 = dVar8 / (double)(int)uVar2;
      dVar10 = ABS(dVar9 / dVar6 - dVar8);
      dVar7 = dVar6 * ((double)(~-(ulong)(dVar10 < 180.0) & (ulong)(360.0 - dVar10) |
                               (ulong)dVar10 & -(ulong)(dVar10 < 180.0)) / dVar7);
      if (180.0 < ABS(dVar9 / dVar6) + ABS(dVar8)) {
        dVar8 = dVar8 - dVar7;
        return (double)(~-(ulong)(dVar8 < -180.0) & (ulong)dVar8 |
                       (ulong)(dVar8 + 360.0) & -(ulong)(dVar8 < -180.0));
      }
      return dVar7 + dVar8;
    }
    if (0 < size) {
      dVar8 = 0.0;
      uVar3 = 0;
      do {
        dVar8 = dVar8 + list[uVar3];
        uVar3 = uVar3 + 1;
      } while ((uint)size != uVar3);
      goto LAB_00107ff1;
    }
  }
  dVar8 = 0.0;
LAB_00107ff1:
  return dVar8 / dVar7;
}

Assistant:

double calculateAngle325(double* list,int size){
    int count = 0;
    int positive = 0, negative = 0;
    if(size != 0){
        double *positiveList = (double*)malloc(sizeof(double));
        double *negativeList = (double*)malloc(sizeof(double));
        for (int i = 0; i < size; i++) {
            if(list[i] >= 0){
                positiveList[positive++] = list[i];
                positiveList = realloc(positiveList, sizeof(double) * (positive + 1));
            }else{
                negativeList[negative++] = list[i];
                negativeList = realloc(negativeList, sizeof(double) * (negative + 1));
            }
            if(list[i] > 90 || list[i] < -90)
                count++;
        }
        double sum = size;
        double percent = positive / sum;
        if(positive == 0 || positive == sum)
            return calculateAvg(list,size);
        if(count > sum * 0.3){
            double avgPositive = calculateAvg(positiveList,positive);
            double avgNegative = calculateAvg(negativeList,negative);

            double angleDifferenceABS = fabs(avgPositive - avgNegative);
            double angleDifference = 0;

            if(angleDifferenceABS >= 180){
                angleDifference = 360 - angleDifferenceABS;
            }else{
                angleDifference = angleDifferenceABS;
            }
            double avgPiece = angleDifference / sum;

            if(fabs(avgNegative) + fabs(avgPositive) > 180){
                double num = avgNegative - positive * avgPiece;
                if(num < -180)
                    return num + 360;
                else
                    return num;
            }else{
                double num = avgNegative + positive * avgPiece;
                return num;
            }
        }else{
            return calculateAvg(list,size);
        }
    }else{
        return 0;
    }
}